

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmLocalNinjaGenerator::WritePools(cmLocalNinjaGenerator *this,ostream *os)

{
  cmState *this_00;
  cmMakefile *this_01;
  pointer pbVar1;
  int iVar2;
  char *__s;
  long lVar3;
  ostream *poVar4;
  string *pool;
  pointer __rhs;
  uint jobs;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pools;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  this_00 = (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
             CMakeInstance->State)._M_t.
            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"JOB_POOLS",(allocator<char> *)&pools);
  __s = cmState::GetGlobalProperty(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (__s == (char *)0x0) {
    this_01 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"CMAKE_JOB_POOLS",(allocator<char> *)&pools);
    __s = cmMakefile::GetDefinition(this_01,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (__s == (char *)0x0) {
      return;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Pools defined by global property JOB_POOLS",
             (allocator<char> *)&pools);
  cmGlobalNinjaGenerator::WriteComment(os,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pools.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pools.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pools.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,__s,(allocator<char> *)&jobs);
  cmSystemTools::ExpandListArgument(&local_68,&pools,false);
  std::__cxx11::string::~string((string *)&local_68);
  pbVar1 = pools.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__rhs = pools.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar1; __rhs = __rhs + 1) {
    lVar3 = std::__cxx11::string::find((char)__rhs,0x3d);
    if ((lVar3 == -1) ||
       (iVar2 = __isoc99_sscanf((__rhs->_M_dataplus)._M_p + lVar3,"=%u",&jobs), iVar2 != 1)) {
      std::operator+(&local_68,"Invalid pool defined by property \'JOB_POOLS\': ",__rhs);
      cmSystemTools::Error(&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      poVar4 = std::operator<<(os,"pool ");
      std::__cxx11::string::substr((ulong)&local_68,(ulong)__rhs);
      poVar4 = std::operator<<(poVar4,(string *)&local_68);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_68);
      poVar4 = std::operator<<(os,"  depth = ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::endl<char,std::char_traits<char>>(os);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&pools);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WritePools(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);

  const char* jobpools =
    this->GetCMakeInstance()->GetState()->GetGlobalProperty("JOB_POOLS");
  if (!jobpools) {
    jobpools = this->GetMakefile()->GetDefinition("CMAKE_JOB_POOLS");
  }
  if (jobpools) {
    cmGlobalNinjaGenerator::WriteComment(
      os, "Pools defined by global property JOB_POOLS");
    std::vector<std::string> pools;
    cmSystemTools::ExpandListArgument(jobpools, pools);
    for (std::string const& pool : pools) {
      const std::string::size_type eq = pool.find('=');
      unsigned int jobs;
      if (eq != std::string::npos &&
          sscanf(pool.c_str() + eq, "=%u", &jobs) == 1) {
        os << "pool " << pool.substr(0, eq) << std::endl;
        os << "  depth = " << jobs << std::endl;
        os << std::endl;
      } else {
        cmSystemTools::Error("Invalid pool defined by property 'JOB_POOLS': " +
                             pool);
      }
    }
  }
}